

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing.cc
# Opt level: O0

int stricmp(char *s1,char *s2)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  
  iVar1 = strcasecmp(in_RDI,in_RSI);
  return iVar1;
}

Assistant:

int
stricmp( const char* s1, const char* s2 )
{
#if HAVE_STRCASECMP
    return strcasecmp(s1, s2);
#else
    const auto x1 = std::make_unique<char[]>(strlen(s1));
    const auto x2 = std::make_unique<char[]>(strlen(s2));

    for (size_t i = 0; s1[i] != '\0' and s2[i] != '\0'; ++i) {
        x1[i] = tolower(s1[i]);
        x2[i] = tolower(s2[i]);
    }
    return strcmp(x1.get(), x2.get());
#endif
}